

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O1

bool __thiscall
__gnu_cxx::__ops::_Val_less_iter::operator()
          (_Val_less_iter *this,pair<crnlib::vec<6U,_float>,_unsigned_int> *__val,
          pair<crnlib::vec<6U,_float>,_unsigned_int> *__it)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  
  fVar1 = (__val->first).m_s[0];
  fVar2 = (__it->first).m_s[0];
  bVar5 = true;
  if (fVar2 <= fVar1) {
    if (fVar1 == fVar2) {
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        uVar7 = uVar6;
        if (uVar6 == 5) goto LAB_0017aa65;
        fVar3 = (__val->first).m_s[uVar6 + 1];
        fVar4 = (__it->first).m_s[uVar6 + 1];
        if (fVar3 < fVar4) {
          uVar7 = 1;
          goto LAB_0017aa65;
        }
        uVar7 = uVar6 + 1;
      } while (fVar3 == fVar4);
      uVar7 = 0;
LAB_0017aa65:
      if ((uVar6 < 5 & (byte)uVar7) != 0) {
        return true;
      }
    }
    if (fVar1 <= fVar2) {
      if (fVar2 != fVar1) {
LAB_0017aab1:
        return __val->second < __it->second;
      }
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        uVar7 = uVar6;
        if (uVar6 == 5) goto LAB_0017aaa3;
        fVar1 = (__it->first).m_s[uVar6 + 1];
        fVar2 = (__val->first).m_s[uVar6 + 1];
        if (fVar1 < fVar2) {
          uVar7 = 1;
          goto LAB_0017aaa3;
        }
        uVar7 = uVar6 + 1;
      } while (fVar1 == fVar2);
      uVar7 = 0;
LAB_0017aaa3:
      if ((uVar6 < 5 & (byte)uVar7) == 0) goto LAB_0017aab1;
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

inline bool operator<(const vec& rhs) const {
    for (uint i = 0; i < N; i++) {
      if (m_s[i] < rhs.m_s[i])
        return true;
      else if (!(m_s[i] == rhs.m_s[i]))
        return false;
    }

    return false;
  }